

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

char * curl_mvaprintf(char *format,__va_list_tag *ap_save)

{
  size_t sVar1;
  undefined1 local_50 [8];
  dynbuf dyn;
  asprintf info;
  __va_list_tag *ap_save_local;
  char *format_local;
  
  dyn.toobig = (size_t)local_50;
  Curl_dyn_init((dynbuf *)dyn.toobig,8000000);
  dprintf_formatf(&dyn.toobig,alloc_addbyter,format,ap_save);
  sVar1 = Curl_dyn_len((dynbuf *)dyn.toobig);
  if (sVar1 == 0) {
    format_local = (*Curl_cstrdup)("");
  }
  else {
    format_local = Curl_dyn_ptr((dynbuf *)dyn.toobig);
  }
  return format_local;
}

Assistant:

char *curl_mvaprintf(const char *format, va_list ap_save)
{
  struct asprintf info;
  struct dynbuf dyn;
  info.b = &dyn;
  Curl_dyn_init(info.b, DYN_APRINTF);
  info.fail = 0;

  (void)dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if(info.fail) {
    Curl_dyn_free(info.b);
    return NULL;
  }
  if(Curl_dyn_len(info.b))
    return Curl_dyn_ptr(info.b);
  return strdup("");
}